

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharedbook.c
# Opt level: O0

int vorbis_book_init_encode(codebook *c,static_codebook *s)

{
  ogg_uint32_t *poVar1;
  long lVar2;
  float fVar3;
  double dVar4;
  static_codebook *s_local;
  codebook *c_local;
  
  memset(c,0,0x60);
  c->c = s;
  c->entries = s->entries;
  c->used_entries = s->entries;
  c->dim = s->dim;
  poVar1 = _make_words(s->lengthlist,s->entries,0);
  c->codelist = poVar1;
  lVar2 = _book_maptype1_quantvals(s);
  c->quantvals = (int)lVar2;
  fVar3 = _float32_unpack(s->q_min);
  dVar4 = rint((double)fVar3);
  c->minval = (int)dVar4;
  fVar3 = _float32_unpack(s->q_delta);
  dVar4 = rint((double)fVar3);
  c->delta = (int)dVar4;
  return 0;
}

Assistant:

int vorbis_book_init_encode(codebook *c,const static_codebook *s){

  memset(c,0,sizeof(*c));
  c->c=s;
  c->entries=s->entries;
  c->used_entries=s->entries;
  c->dim=s->dim;
  c->codelist=_make_words(s->lengthlist,s->entries,0);
  /* c->valuelist=_book_unquantize(s,s->entries,NULL); */
  c->quantvals=_book_maptype1_quantvals(s);
  c->minval=(int)rint(_float32_unpack(s->q_min));
  c->delta=(int)rint(_float32_unpack(s->q_delta));

  return(0);
}